

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O0

Entry * __thiscall
Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::grow
          (PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*> *this,
          Entry *oldEntries,size_t *newMemUsed)

{
  undefined1 auVar1 [16];
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  StringKey *this_00;
  Entry *pEVar6;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  ulong uVar7;
  Entry *newEntry;
  int newIndex;
  Entry *oldEntry;
  uint32_t oldIndex;
  uint32_t mask;
  Entry *entries;
  uint32_t numNewEntries;
  Entry *in_stack_ffffffffffffff60;
  value_type *in_stack_ffffffffffffff68;
  vector<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*>_>
  *in_stack_ffffffffffffff70;
  Entry *pEVar8;
  Entry *local_88;
  uint local_4c;
  uint local_3c;
  
  std::
  vector<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*>_>
  ::push_back(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  uVar2 = *(int *)(in_RDI + 8) * 2;
  uVar3 = CONCAT44(0,uVar2);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar3;
  uVar4 = SUB168(auVar1 * ZEXT816(0x20),0);
  uVar7 = uVar4 + 8;
  if (SUB168(auVar1 * ZEXT816(0x20),8) != 0 || 0xfffffffffffffff7 < uVar4) {
    uVar7 = 0xffffffffffffffff;
  }
  puVar5 = (ulong *)operator_new__(uVar7);
  *puVar5 = uVar3;
  pEVar6 = (Entry *)(puVar5 + 1);
  if (uVar3 != 0) {
    pEVar8 = pEVar6 + uVar3;
    local_88 = pEVar6;
    do {
      Entry::Entry(in_stack_ffffffffffffff60);
      local_88 = local_88 + 1;
    } while (local_88 != pEVar8);
  }
  *in_RDX = (ulong)uVar2 << 5;
  for (local_3c = 0; local_3c < *(uint *)(in_RDI + 8); local_3c = local_3c + 1) {
    this_00 = (StringKey *)(in_RSI + (ulong)local_3c * 0x20);
    if (this_00[1]._val != (char *)0x0) {
      local_4c = StringKey::hash(this_00);
      while (pEVar8 = pEVar6 + (local_4c & uVar2 - 1), pEVar8->value != (PtexCachedReader *)0x0) {
        local_4c = local_4c + 1;
      }
      StringKey::move(&pEVar8->key,this_00);
      pEVar8->value = (PtexCachedReader *)this_00[1]._val;
    }
  }
  *(uint *)(in_RDI + 8) = uVar2;
  return pEVar6;
}

Assistant:

Entry* grow(Entry* oldEntries, size_t& newMemUsed)
    {
        _oldEntries.push_back(oldEntries);
        uint32_t numNewEntries = _numEntries*2;
        Entry* entries = new Entry[numNewEntries];
        newMemUsed = numNewEntries * sizeof(Entry);
        uint32_t mask = numNewEntries-1;
        for (uint32_t oldIndex = 0; oldIndex < _numEntries; ++oldIndex) {
            Entry& oldEntry = oldEntries[oldIndex];
            if (oldEntry.value) {
                for (int newIndex = oldEntry.key.hash();; ++newIndex) {
                    Entry& newEntry = entries[newIndex&mask];
                    if (!newEntry.value) {
                        newEntry.key.move(oldEntry.key);
                        newEntry.value = oldEntry.value;
                        break;
                    }
                }
            }
        }
        _numEntries = numNewEntries;
        return entries;
    }